

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::CoverpointSyntax::setChild(CoverpointSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004b46f0 + *(int *)(&DAT_004b46f0 + index * 4)))();
  return;
}

Assistant:

void CoverpointSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 2: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 3: coverpoint = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 5: iff = child.node() ? &child.node()->as<CoverageIffClauseSyntax>() : nullptr; return;
        case 6: openBrace = child.token(); return;
        case 7: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 8: closeBrace = child.token(); return;
        case 9: emptySemi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}